

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCPUWarmup.cpp
# Opt level: O2

void tcu::warmupCPU(void)

{
  int i;
  uint numIterations;
  deUint64 dVar1;
  deUint64 dVar2;
  int i_1;
  long lVar3;
  int measurementNdx;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float local_b0;
  long temp [5];
  undefined1 local_80 [8];
  deInt64 times [3];
  float absoluteDeviations [5];
  
  local_b0 = *warmupCPUInternal::g_dummy;
  uVar4 = 1;
  do {
    numIterations = uVar4;
    if (0x3fffffff < numIterations) break;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      dVar1 = deGetMicroseconds();
      local_b0 = dummyComputation(local_b0,numIterations);
      dVar2 = deGetMicroseconds();
      times[lVar3] = dVar2 - dVar1;
    }
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      temp[lVar3] = times[lVar3];
    }
    std::__sort<long*,__gnu_cxx::__ops::_Iter_less_iter>(temp,temp + 3);
    uVar4 = numIterations * 2;
  } while (CONCAT44(temp[1]._4_4_,(float)temp[1]) < 10000);
  for (uVar4 = 0; uVar4 != 0x32; uVar4 = uVar4 + 1) {
    if (4 < uVar4) {
      for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
        temp[lVar3] = times[lVar3];
      }
      std::__sort<long*,__gnu_cxx::__ops::_Iter_less_iter>(temp,local_80);
      fVar7 = (float)temp[2];
      for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
        fVar6 = (float)times[lVar3] - fVar7;
        uVar5 = -(uint)(-fVar6 <= fVar6);
        absoluteDeviations[lVar3] = (float)(~uVar5 & (uint)-fVar6 | (uint)fVar6 & uVar5);
      }
      for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
        *(float *)((long)temp + lVar3 * 4) = absoluteDeviations[lVar3];
      }
      std::__sort<float*,__gnu_cxx::__ops::_Iter_less_iter>(temp,(long)temp + 0x14);
      if ((float)temp[1] / fVar7 <= 0.05) break;
    }
    dVar1 = deGetMicroseconds();
    local_b0 = dummyComputation(local_b0,numIterations);
    dVar2 = deGetMicroseconds();
    times[(ulong)uVar4 % 5] = dVar2 - dVar1;
  }
  *warmupCPUInternal::g_dummy = local_b0;
  return;
}

Assistant:

void warmupCPU (void)
{
	float	dummy				= *warmupCPUInternal::g_dummy.m_v;
	int		computationSize		= 1;

	// Do a rough calibration for computationSize to get dummyComputation's running time above a certain threshold.
	while (computationSize < 1<<30) // \note This condition is unlikely to be met. The "real" loop exit is the break below.
	{
		const float		singleMeasurementThreshold	= 10000.0f;
		const int		numMeasurements				= 3;
		deInt64			times[numMeasurements];

		for (int i = 0; i < numMeasurements; i++)
		{
			const deUint64 startTime = deGetMicroseconds();
			dummy = dummyComputation(dummy, computationSize);
			times[i] = (deInt64)(deGetMicroseconds() - startTime);
		}

		if (floatMedian(times) >= singleMeasurementThreshold)
			break;

		computationSize *= 2;
	}

	// Do dummyComputations until running time seems stable enough.
	{
		const int			maxNumMeasurements							= 50;
		const int			numConsecutiveMeasurementsRequired			= 5;
		const float			relativeMedianAbsoluteDeviationThreshold	= 0.05f;
		deInt64				latestTimes[numConsecutiveMeasurementsRequired];

		for (int measurementNdx = 0;

			 measurementNdx < maxNumMeasurements &&
			 (measurementNdx < numConsecutiveMeasurementsRequired ||
			  floatRelativeMedianAbsoluteDeviation(latestTimes) > relativeMedianAbsoluteDeviationThreshold);

			 measurementNdx++)
		{
			const deUint64 startTime = deGetMicroseconds();
			dummy = dummyComputation(dummy, computationSize);
			latestTimes[measurementNdx % numConsecutiveMeasurementsRequired] = (deInt64)(deGetMicroseconds() - startTime);
		}
	}

	*warmupCPUInternal::g_dummy.m_v = dummy;
}